

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

int __thiscall
lzham::lzcompressor::enumerate_lz_decisions
          (lzcompressor *this,uint ofs,state *cur_state,
          vector<lzham::lzcompressor::lzpriced_decision> *decisions,uint min_match_len,
          uint max_match_len)

{
  uint uVar1;
  lzpriced_decision *plVar2;
  uchar *puVar3;
  uint *puVar4;
  char cVar5;
  uint uVar6;
  dict_match *pdVar7;
  uint i;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  lzpriced_decision dec;
  uint local_7c;
  uint local_78;
  uint local_6c;
  bit_cost_t local_60;
  lzdecision local_50;
  undefined4 uStack_44;
  bit_cost_t local_40;
  search_accelerator *local_38;
  
  local_38 = &this->m_accel;
  uVar9 = (this->m_accel).m_max_dict_size_mask;
  uVar6 = (this->m_accel).m_lookahead_pos;
  uVar13 = decisions->m_size;
  uVar12 = (uint)decisions;
  if (min_match_len < 2) {
    if (uVar13 != 1) {
      if ((uVar13 == 0 && decisions->m_capacity == 0) &&
         (cVar5 = lzham::elemental_vector::increase_capacity
                            (uVar12,true,1,(_func_void_void_ptr_void_ptr_uint *)0x18,true),
         cVar5 == '\0')) {
        return -1;
      }
      decisions->m_size = 1;
    }
    plVar2 = decisions->m_p;
    (plVar2->super_lzdecision).m_pos = ofs;
    (plVar2->super_lzdecision).m_len = 0;
    (plVar2->super_lzdecision).m_dist = 0;
    *(bit_cost_t *)(&plVar2->field_0xc + 4) = 0;
    local_60 = state::get_cost(cur_state,&this->super_CLZBase,local_38,&plVar2->super_lzdecision);
    *(bit_cost_t *)(&plVar2->field_0xc + 4) = local_60;
    local_78 = 1;
  }
  else {
    local_60 = 0xffffffffffffffff;
    local_78 = 0;
    if (uVar13 != 0) {
      decisions->m_size = 0;
    }
  }
  uVar13 = ofs - (uVar9 & uVar6);
  uVar14 = (ulong)max_match_len;
  lVar8 = 0;
  local_6c = 0;
  local_7c = 0;
  do {
    uVar1 = (cur_state->super_state_base).m_match_hist[lVar8];
    uVar11 = 0;
    if (((int)uVar1 <= (int)((this->m_accel).m_cur_dict_size + uVar13)) &&
       (uVar11 = 0, max_match_len != 0)) {
      uVar6 = (this->m_accel).m_lookahead_pos + uVar13;
      uVar9 = (this->m_accel).m_max_dict_size_mask;
      puVar3 = (this->m_accel).m_dict.m_p;
      uVar10 = 0;
      do {
        uVar11 = uVar10;
        if (puVar3[uVar10 + (uVar6 - uVar1 & uVar9)] != puVar3[uVar10 + (uVar6 & uVar9)]) break;
        uVar10 = uVar10 + 1;
        uVar11 = uVar14;
      } while (uVar14 != uVar10);
    }
    uVar9 = (uint)uVar11;
    if (min_match_len <= uVar9) {
      if ((1 < uVar9) || (lVar8 == 0 && uVar9 == 1)) {
        if (local_6c <= uVar9) {
          local_6c = uVar9;
        }
        local_50.m_dist = ~(uint)lVar8;
        local_50.m_pos = ofs;
        local_50.m_len = uVar9;
        local_40 = state::get_cost(cur_state,&this->super_CLZBase,local_38,&local_50);
        uVar6 = decisions->m_size;
        if (decisions->m_capacity <= uVar6) {
          cVar5 = lzham::elemental_vector::increase_capacity
                            (uVar12,(bool)((char)uVar6 + '\x01'),1,
                             (_func_void_void_ptr_void_ptr_uint *)0x18,true);
          if (cVar5 == '\0') {
            return -1;
          }
          uVar6 = decisions->m_size;
        }
        plVar2 = decisions->m_p;
        plVar2[uVar6].m_cost = local_40;
        plVar2 = plVar2 + uVar6;
        (plVar2->super_lzdecision).m_pos = local_50.m_pos;
        (plVar2->super_lzdecision).m_len = local_50.m_len;
        *(ulong *)&(plVar2->super_lzdecision).m_dist = CONCAT44(uStack_44,local_50.m_dist);
        uVar1 = decisions->m_size;
        decisions->m_size = uVar1 + 1;
        if ((local_78 < uVar9) || ((uVar9 == local_78 && (local_40 < local_60)))) {
          local_60 = local_40;
          local_7c = uVar1;
          local_78 = uVar9;
        }
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  if (max_match_len < 2) {
    return local_7c;
  }
  if (this->m_fast_bytes <= local_6c) {
    return local_7c;
  }
  pdVar7 = search_accelerator::find_matches(local_38,uVar13,true);
  if (pdVar7 == (dict_match *)0x0) {
    return local_7c;
  }
  do {
    uVar9 = pdVar7->m_len + 2;
    if (max_match_len <= uVar9) {
      uVar9 = max_match_len;
    }
    if ((min_match_len <= uVar9) && (local_6c < uVar9)) {
      local_50.m_dist = pdVar7->m_dist & 0x7fffffff;
      uVar11 = (ulong)uVar9;
      if ((0x101 < max_match_len) &&
         ((uVar9 == 0x101 &&
          (uVar11 = 0, local_50.m_dist <= (int)((this->m_accel).m_cur_dict_size + uVar13))))) {
        uVar6 = (this->m_accel).m_lookahead_pos + uVar13;
        uVar9 = (this->m_accel).m_max_dict_size_mask;
        puVar3 = (this->m_accel).m_dict.m_p;
        uVar10 = 0x101;
        do {
          uVar11 = uVar10;
          if (puVar3[uVar10 + (uVar6 - local_50.m_dist & uVar9)] != puVar3[uVar10 + (uVar6 & uVar9)]
             ) break;
          uVar10 = uVar10 + 1;
          uVar11 = uVar14;
        } while (uVar14 != uVar10);
      }
      uVar6 = (uint)uVar11;
      local_50.m_pos = ofs;
      local_50.m_len = uVar6;
      local_40 = state::get_cost(cur_state,&this->super_CLZBase,local_38,&local_50);
      uVar9 = decisions->m_size;
      if (decisions->m_capacity <= uVar9) {
        cVar5 = lzham::elemental_vector::increase_capacity
                          (uVar12,(bool)((char)uVar9 + '\x01'),1,
                           (_func_void_void_ptr_void_ptr_uint *)0x18,true);
        if (cVar5 == '\0') {
          return -1;
        }
        uVar9 = decisions->m_size;
      }
      plVar2 = decisions->m_p;
      plVar2[uVar9].m_cost = local_40;
      plVar2 = plVar2 + uVar9;
      (plVar2->super_lzdecision).m_pos = local_50.m_pos;
      (plVar2->super_lzdecision).m_len = local_50.m_len;
      *(ulong *)&(plVar2->super_lzdecision).m_dist = CONCAT44(uStack_44,local_50.m_dist);
      uVar1 = decisions->m_size;
      decisions->m_size = uVar1 + 1;
      if ((local_78 < uVar6) || ((uVar6 == local_78 && (local_40 < local_60)))) {
        local_60 = local_40;
        local_7c = uVar1;
        local_78 = uVar6;
      }
    }
    puVar4 = &pdVar7->m_dist;
    pdVar7 = pdVar7 + 1;
    if ((int)*puVar4 < 0) {
      return local_7c;
    }
  } while( true );
}

Assistant:

int lzcompressor::enumerate_lz_decisions(uint ofs, const state& cur_state, lzham::vector<lzpriced_decision>& decisions, uint min_match_len, uint max_match_len)
   {
      LZHAM_ASSERT(min_match_len >= 1);

      uint start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();
      LZHAM_ASSERT(ofs >= start_ofs);
      const uint lookahead_ofs = ofs - start_ofs;

      uint largest_index = 0;
      uint largest_len;
      bit_cost_t largest_cost;

      if (min_match_len <= 1)
      {
         if (!decisions.try_resize(1))
         {
            LZHAM_LOG_ERROR(7038);
            return -1;
         }

         lzpriced_decision& lit_dec = decisions[0];
         lit_dec.init(ofs, 0, 0, 0);
         lit_dec.m_cost = cur_state.get_cost(*this, m_accel, lit_dec);
         largest_cost = lit_dec.m_cost;

         largest_len = 1;
      }
      else
      {
         if (!decisions.try_resize(0))
         {
            LZHAM_LOG_ERROR(7039);
            return -1;
         }

         largest_len = 0;
         largest_cost = cBitCostMax;
      }

      uint match_hist_max_len = 0;

      // Add rep matches.
      for (uint i = 0; i < cMatchHistSize; i++)
      {
         uint hist_match_len = m_accel.get_match_len(lookahead_ofs, cur_state.m_match_hist[i], max_match_len);
         if (hist_match_len < min_match_len)
            continue;

         if ( ((hist_match_len == 1) && (i == 0)) || (hist_match_len >= CLZBase::cMinMatchLen) )
         {
            match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

            lzpriced_decision dec(ofs, hist_match_len, -((int)i + 1));
            dec.m_cost = cur_state.get_cost(*this, m_accel, dec);

            if (!decisions.try_push_back(dec))
            {
               LZHAM_LOG_ERROR(7040);
               return -1;
            }

            if ( (hist_match_len > largest_len) || ((hist_match_len == largest_len) && (dec.m_cost < largest_cost)) )
            {
               largest_index = decisions.size() - 1;
               largest_len = hist_match_len;
               largest_cost = dec.m_cost;
            }
         }
      }

      // Now add full matches.
      if ((max_match_len >= CLZBase::cMinMatchLen) && (match_hist_max_len < m_fast_bytes))
      {
         const dict_match* pMatches = m_accel.find_matches(lookahead_ofs);

         if (pMatches)
         {
            for ( ; ; )
            {
               uint match_len = math::minimum(pMatches->get_len(), max_match_len);
               LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));

               // Full matches are very likely to be more expensive than rep matches of the same length, so don't bother evaluating them.
               if ((match_len >= min_match_len) && (match_len > match_hist_max_len))
               {
                  if ((max_match_len > CLZBase::cMaxMatchLen) && (match_len == CLZBase::cMaxMatchLen))
                  {
                     match_len = m_accel.get_match_len(lookahead_ofs, pMatches->get_dist(), max_match_len, CLZBase::cMaxMatchLen);
                  }

                  lzpriced_decision dec(ofs, match_len, pMatches->get_dist());
                  dec.m_cost = cur_state.get_cost(*this, m_accel, dec);

                  if (!decisions.try_push_back(dec))
                  {
                     LZHAM_LOG_ERROR(7041);
                     return -1;
                  }

                  if ( (match_len > largest_len) || ((match_len == largest_len) && (dec.get_cost() < largest_cost)) )
                  {
                     largest_index = decisions.size() - 1;
                     largest_len = match_len;
                     largest_cost = dec.get_cost();
                  }
               }
               if (pMatches->is_last())
                  break;
               pMatches++;
            }
         }
      }

      return largest_index;
   }